

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

void __thiscall
QTextDocumentLayoutPrivate::drawTableCellBorder
          (QTextDocumentLayoutPrivate *this,QRectF *cellRect,QPainter *painter,QTextTable *table,
          QTextTableData *td,QTextTableCell *cell)

{
  long lVar1;
  QTextDocument *pQVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  RenderHints RVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  byte bVar13;
  long lVar14;
  bool bVar15;
  qreal *pqVar16;
  bool bVar17;
  BorderPaginator *pBVar18;
  long in_FS_OFFSET;
  bool bVar19;
  double dVar20;
  double bottomMargin;
  qreal local_180;
  QRectF local_138;
  QRectF local_118;
  QRectF local_f8;
  QTextTableCell local_d8;
  BorderPaginator local_c8;
  BorderPaginator paginator;
  
  bVar13 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (td->super_QTextFrameData).border.val + (td->cellSpacing).val;
  local_180 = (double)((td->super_QTextFrameData).effectiveTopMargin.val + iVar3) * 0.015625;
  bottomMargin = (double)(iVar3 + (td->super_QTextFrameData).effectiveBottomMargin.val) * 0.015625;
  QTextTable::format((QTextTable *)&paginator);
  iVar4 = QTextTableFormat::headerRowCount((QTextTableFormat *)&paginator);
  iVar5 = QTextTable::rows(table);
  iVar3 = iVar5 + -1;
  if (iVar4 < iVar5 + -1) {
    iVar3 = iVar4;
  }
  QTextFormat::~QTextFormat((QTextFormat *)&paginator);
  if ((0 < iVar3) && (iVar4 = QTextTableCell::row(cell), iVar3 <= iVar4)) {
    local_180 = local_180 + (double)(td->headerHeight).val * 0.015625;
  }
  pqVar16 = (qreal *)&DAT_005fb670;
  pBVar18 = &paginator;
  for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
    pBVar18->pageHeight = *pqVar16;
    pqVar16 = pqVar16 + (ulong)bVar13 * -2 + 1;
    pBVar18 = (BorderPaginator *)((long)pBVar18 + (ulong)bVar13 * -0x10 + 8);
  }
  BorderPaginator::BorderPaginator
            (&paginator,(this->super_QAbstractTextDocumentLayoutPrivate).document,cellRect,local_180
             ,bottomMargin,0.0);
  RVar6 = QPainter::renderHints(painter);
  QPainter::setRenderHint(painter,Antialiasing,true);
  iVar3 = paginator.topPage;
  do {
    if (paginator.bottomPage < iVar3) {
      if (((uint)RVar6.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
                 super_QFlagsStorage<QPainter::RenderHint>.i & 1) == 0) {
        QPainter::setRenderHint(painter,Antialiasing,false);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    local_f8.w._0_4_ = 0xffffffff;
    local_f8.w._4_4_ = 0xffffffff;
    local_f8.h._0_4_ = 0xffffffff;
    local_f8.h._4_4_ = 0xffffffff;
    local_f8.xp._0_4_ = 0xffffffff;
    local_f8.xp._4_4_ = 0xffffffff;
    local_f8.yp._0_4_ = 0xffffffff;
    local_f8.yp._4_4_ = 0xffffffff;
    BorderPaginator::clipRect(&local_f8,&paginator,iVar3);
    if ((0.0 < (double)CONCAT44(local_f8.w._4_4_,local_f8.w._0_4_)) &&
       (0.0 < (double)CONCAT44(local_f8.h._4_4_,local_f8.h._0_4_))) {
      dVar20 = cellRect->yp;
      iVar4 = QTextTableCell::row(cell);
      dVar20 = (double)(td->rowPositions).d.ptr[iVar4].val * -0.015625 + dVar20;
      QTextTable::format((QTextTable *)&local_c8);
      iVar4 = QTextTableFormat::headerRowCount((QTextTableFormat *)&local_c8);
      QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
      QTextTable::format((QTextTable *)&local_c8);
      iVar5 = QTextTableFormat::headerRowCount((QTextTableFormat *)&local_c8);
      QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
      iVar7 = QTextTableCell::row(cell);
      QTextTable::format((QTextTable *)&local_c8);
      iVar8 = QTextTableFormat::headerRowCount((QTextTableFormat *)&local_c8);
      QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
      iVar9 = QTextTableCell::row(cell);
      iVar10 = QTextTableCell::row(cell);
      iVar11 = QTextTableCell::rowSpan(cell);
      iVar12 = QTextTable::rows(table);
      bVar17 = false;
      if ((iVar8 <= iVar7) && (bVar17 = false, iVar9 != iVar4)) {
        pQVar2 = (this->super_QAbstractTextDocumentLayoutPrivate).document;
        adjacentCell((QTextTable *)&local_d8,(QTextTableCell *)table,(Edge)cell);
        QTextTableData::cellRect(&local_138,td,&local_d8);
        local_118.xp = local_138.xp + 0.0;
        local_118.yp = dVar20 + local_138.yp;
        local_118.w = local_138.w;
        local_118.h = local_138.h;
        BorderPaginator::BorderPaginator(&local_c8,pQVar2,&local_118,local_180,bottomMargin,0.0);
        bVar17 = local_c8.bottomPage < iVar3;
      }
      if (iVar11 + iVar10 < iVar12) {
        pQVar2 = (this->super_QAbstractTextDocumentLayoutPrivate).document;
        adjacentCell((QTextTable *)&local_d8,(QTextTableCell *)table,(Edge)cell);
        QTextTableData::cellRect(&local_138,td,&local_d8);
        local_118.xp = local_138.xp + 0.0;
        local_118.yp = dVar20 + local_138.yp;
        local_118.w = local_138.w;
        local_118.h = local_138.h;
        BorderPaginator::BorderPaginator(&local_c8,pQVar2,&local_118,local_180,bottomMargin,0.0);
        bVar15 = iVar3 < local_c8.topPage;
      }
      else {
        bVar15 = false;
      }
      iVar4 = iVar4 + -1;
      bVar19 = iVar3 != paginator.bottomPage;
      bVar13 = iVar3 == paginator.topPage & bVar17;
      bVar17 = (bool)(iVar5 < 1 & bVar13);
      if (td->borderCollapse == true) {
        bVar19 = (bool)((iVar3 != paginator.bottomPage | bVar15) & iVar8 <= iVar7);
        bVar15 = iVar5 < 1 && iVar3 != paginator.topPage;
        if ((iVar7 < iVar8) || (iVar3 == paginator.topPage && (0 < iVar5 & bVar13) == 0)) {
LAB_00471bff:
          drawCellBorder(this,painter,table,td,cell,&local_f8,TopEdge,-1,true,true,bVar17);
          iVar4 = -1;
        }
      }
      else {
        bVar15 = true;
        if (iVar3 == paginator.topPage) {
          bVar15 = false;
          goto LAB_00471bff;
        }
      }
      drawCellBorder(this,painter,table,td,cell,&local_f8,LeftEdge,iVar4,(bool)(bVar15 ^ 1U),
                     (bool)(bVar19 ^ 1U),bVar17);
      drawCellBorder(this,painter,table,td,cell,&local_f8,RightEdge,iVar4,(bool)(bVar15 ^ 1U),
                     (bool)(bVar19 ^ 1U),bVar17);
      if (bVar19 == false) {
        drawCellBorder(this,painter,table,td,cell,&local_f8,BottomEdge,-1,true,true,false);
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void QTextDocumentLayoutPrivate::drawTableCellBorder(const QRectF &cellRect, QPainter *painter,
                                                     QTextTable *table, QTextTableData *td,
                                                     const QTextTableCell &cell) const
{
#ifndef QT_NO_CSSPARSER
    qreal topMarginAfterPageBreak = (td->effectiveTopMargin + td->cellSpacing + td->border).toReal();
    qreal bottomMargin = (td->effectiveBottomMargin + td->cellSpacing + td->border).toReal();

    const int headerRowCount = qMin(table->format().headerRowCount(), table->rows() - 1);
    if (headerRowCount > 0 && cell.row() >= headerRowCount)
        topMarginAfterPageBreak += td->headerHeight.toReal();

    BorderPaginator paginator(document, cellRect, topMarginAfterPageBreak, bottomMargin, 0);

    bool turn_off_antialiasing = !(painter->renderHints() & QPainter::Antialiasing);
    painter->setRenderHint(QPainter::Antialiasing);

    // paint cell borders for every page the cell appears on
    for (int page = paginator.topPage; page <= paginator.bottomPage; ++page) {
        const QRectF clipped = paginator.clipRect(page);
        if (!clipped.isValid())
            continue;

        const qreal offset = cellRect.top() - td->rowPositions.at(cell.row()).toReal();
        const int lastHeaderRow = table->format().headerRowCount() - 1;
        const bool tableHasHeader = table->format().headerRowCount() > 0;
        const bool isHeaderRow = cell.row() < table->format().headerRowCount();
        const bool isFirstRow = cell.row() == lastHeaderRow + 1;
        const bool isLastRow = cell.row() + cell.rowSpan() >= table->rows();
        const bool previousRowOnPreviousPage = !isFirstRow
                && !isHeaderRow
                && BorderPaginator(document,
                                   td->cellRect(adjacentCell(table, cell, QCss::TopEdge)).translated(0, offset),
                                   topMarginAfterPageBreak,
                                   bottomMargin,
                                   0).bottomPage < page;
        const bool nextRowOnNextPage = !isLastRow
                && BorderPaginator(document,
                                   td->cellRect(adjacentCell(table, cell, QCss::BottomEdge)).translated(0, offset),
                                   topMarginAfterPageBreak,
                                   bottomMargin,
                                   0).topPage > page;
        const bool rowStartsOnPage = page == paginator.topPage;
        const bool rowEndsOnPage = page == paginator.bottomPage;
        const bool rowStartsOnPageTop = !tableHasHeader
                && rowStartsOnPage
                && previousRowOnPreviousPage;
        const bool rowStartsOnPageBelowHeader = tableHasHeader
                && rowStartsOnPage
                && previousRowOnPreviousPage;

        const bool suppressTopBorder = td->borderCollapse
                ? !isHeaderRow && (!rowStartsOnPage || rowStartsOnPageBelowHeader)
                : !rowStartsOnPage;
        const bool suppressBottomBorder = td->borderCollapse
                ? !isHeaderRow && (!rowEndsOnPage || nextRowOnNextPage)
                : !rowEndsOnPage;
        const bool doNotAdjustTopAnchor = td->borderCollapse
                ? !tableHasHeader && !rowStartsOnPage
                : !rowStartsOnPage;
        const bool doNotAdjustBottomAnchor = suppressBottomBorder;

        if (!suppressTopBorder) {
            drawCellBorder(this, painter, table, td, cell, clipped, QCss::TopEdge,
                           -1, true, true, rowStartsOnPageTop);
        }

        drawCellBorder(this, painter, table, td, cell, clipped, QCss::LeftEdge,
                       suppressTopBorder ? lastHeaderRow : -1,
                       !doNotAdjustTopAnchor,
                       !doNotAdjustBottomAnchor,
                       rowStartsOnPageTop);
        drawCellBorder(this, painter, table, td, cell, clipped, QCss::RightEdge,
                       suppressTopBorder ? lastHeaderRow : -1,
                       !doNotAdjustTopAnchor,
                       !doNotAdjustBottomAnchor,
                       rowStartsOnPageTop);

        if (!suppressBottomBorder) {
            drawCellBorder(this, painter, table, td, cell, clipped, QCss::BottomEdge,
                           -1, true, true, false);
        }
    }

    if (turn_off_antialiasing)
        painter->setRenderHint(QPainter::Antialiasing, false);
#else
    Q_UNUSED(cell);
    Q_UNUSED(cellRect);
    Q_UNUSED(painter);
    Q_UNUSED(table);
    Q_UNUSED(td);
    Q_UNUSED(cell);
#endif
}